

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_ShaManStop(Abc_ShaMan_t *p)

{
  void *__ptr;
  void *__ptr_00;
  int *__ptr_01;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  long lVar3;
  
  pVVar1 = p->vBuckets;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      __ptr = pVVar1->pArray[lVar2];
      if (0 < *(int *)((long)__ptr + 4)) {
        lVar3 = 0;
        do {
          __ptr_00 = *(void **)(*(long *)((long)__ptr + 8) + lVar3 * 8);
          if (__ptr_00 != (void *)0x0) {
            if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
              free(*(void **)((long)__ptr_00 + 8));
              *(undefined8 *)((long)__ptr_00 + 8) = 0;
            }
            free(__ptr_00);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < *(int *)((long)__ptr + 4));
      }
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        *(undefined8 *)((long)__ptr + 8) = 0;
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar2 = lVar2 + 1;
      pVVar1 = p->vBuckets;
    } while (lVar2 < pVVar1->nSize);
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vBuckets->pArray = (void **)0x0;
    }
    if (p->vBuckets != (Vec_Ptr_t *)0x0) {
      free(p->vBuckets);
      p->vBuckets = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vObj2Lit != (Vec_Int_t *)0x0) {
    __ptr_01 = p->vObj2Lit->pArray;
    if (__ptr_01 != (int *)0x0) {
      free(__ptr_01);
      p->vObj2Lit->pArray = (int *)0x0;
    }
    if (p->vObj2Lit != (Vec_Int_t *)0x0) {
      free(p->vObj2Lit);
      p->vObj2Lit = (Vec_Int_t *)0x0;
    }
  }
  if (p != (Abc_ShaMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Abc_ShaManStop( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    int i;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        Vec_VecFree( (Vec_Vec_t *)vBucket );
    Vec_PtrFreeP( &p->vBuckets );
    Vec_IntFreeP( &p->vObj2Lit );
    ABC_FREE( p );
}